

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFiltersExport.cpp
# Opt level: O2

char * helicsFilterGetTag(HelicsFilter filt,char *tagname)

{
  Interface *this;
  string *psVar1;
  _Alloc_hider _Var2;
  string_view tag;
  allocator<char> local_31;
  char *local_30;
  size_t local_28;
  
  _Var2._M_p = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
  if ((filt != (HelicsFilter)0x0) && (*(int *)((long)filt + 4) == -0x13d9fed9)) {
    this = *(Interface **)((long)filt + 8);
    if (tagname == (char *)0x0) {
      std::__cxx11::string::string((string *)&local_30,&gHelicsEmptyStr_abi_cxx11_);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,tagname,&local_31);
    }
    tag._M_str = local_30;
    tag._M_len = local_28;
    psVar1 = helics::Interface::getTag_abi_cxx11_(this,tag);
    std::__cxx11::string::~string((string *)&local_30);
    _Var2._M_p = (psVar1->_M_dataplus)._M_p;
  }
  return _Var2._M_p;
}

Assistant:

const char* helicsFilterGetTag(HelicsFilter filt, const char* tagname)
{
    auto* filtObj = getFilterObj(filt, nullptr);
    if (filtObj == nullptr) {
        return gHelicsEmptyStr.c_str();
    }
    try {
        const std::string& info = filtObj->filtPtr->getTag(AS_STRING(tagname));
        return info.c_str();
    }
    // LCOV_EXCL_START
    catch (...) {
        return gHelicsEmptyStr.c_str();
    }
    // LCOV_EXCL_STOP
}